

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

void __thiscall CFG::~CFG(CFG *this)

{
  bool bVar1;
  reference ppCVar2;
  reference ppCVar3;
  CfgEdge *edge;
  iterator __end1_1;
  iterator __begin1_1;
  set<CfgEdge_*,_std::less<CfgEdge_*>,_std::allocator<CfgEdge_*>_> *__range1_1;
  CfgNode *node;
  iterator __end1;
  iterator __begin1;
  set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *__range1;
  CFG *this_local;
  
  this->_vptr_CFG = (_func_int **)&PTR__CFG_001718f8;
  __end1 = std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::begin
                     (&this->m_nodes);
  node = (CfgNode *)
         std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::end(&this->m_nodes);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&node);
    if (!bVar1) break;
    ppCVar2 = std::_Rb_tree_const_iterator<CfgNode_*>::operator*(&__end1);
    if (*ppCVar2 != (CfgNode *)0x0) {
      (*(*ppCVar2)->_vptr_CfgNode[1])();
    }
    std::_Rb_tree_const_iterator<CfgNode_*>::operator++(&__end1);
  }
  __end1_1 = std::set<CfgEdge_*,_std::less<CfgEdge_*>,_std::allocator<CfgEdge_*>_>::begin
                       (&this->m_edges);
  edge = (CfgEdge *)
         std::set<CfgEdge_*,_std::less<CfgEdge_*>,_std::allocator<CfgEdge_*>_>::end(&this->m_edges);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&edge);
    if (!bVar1) break;
    ppCVar3 = std::_Rb_tree_const_iterator<CfgEdge_*>::operator*(&__end1_1);
    if (*ppCVar3 != (CfgEdge *)0x0) {
      (*(*ppCVar3)->_vptr_CfgEdge[1])();
    }
    std::_Rb_tree_const_iterator<CfgEdge_*>::operator++(&__end1_1);
  }
  std::
  map<CfgNode_*,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>,_std::less<CfgNode_*>,_std::allocator<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>_>
  ::~map(&this->m_preds);
  std::
  map<CfgNode_*,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>,_std::less<CfgNode_*>,_std::allocator<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>_>
  ::~map(&this->m_succs);
  std::set<CfgEdge_*,_std::less<CfgEdge_*>,_std::allocator<CfgEdge_*>_>::~set(&this->m_edges);
  std::
  map<unsigned_long,_CfgNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgNode_*>_>_>
  ::~map(&this->m_nodesMap);
  std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::~set(&this->m_nodes);
  std::__cxx11::string::~string((string *)&this->m_functionName);
  return;
}

Assistant:

CFG::~CFG() {
	for (CfgNode* node : m_nodes)
		delete node;

	for (CfgEdge* edge : m_edges)
		delete edge;
}